

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexchange.cpp
# Opt level: O3

void enq(Block *b,ProxyWithLink *cp)

{
  Link *pLVar1;
  mapped_type *pmVar2;
  pointer pBVar3;
  long lVar4;
  long lVar5;
  
  pLVar1 = cp->link_;
  pBVar3 = (pLVar1->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pLVar1->neighbors_).
                              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pBVar3) >> 3)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      pmVar2 = std::
               map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
               ::operator[](&(cp->super_Proxy).outgoing_,(key_type *)((long)&pBVar3->gid + lVar4));
      (*(pmVar2->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar2,b,4);
      lVar5 = lVar5 + 1;
      pBVar3 = (pLVar1->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 8;
    } while (lVar5 < (int)((ulong)((long)(pLVar1->neighbors_).
                                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar3)
                          >> 3));
  }
  b->count = b->count + 1;
  return;
}

Assistant:

void enq(Block* b, const diy::Master::ProxyWithLink& cp)
{
    diy::Link* l = cp.link();

    for (int i = 0; i < l->size(); ++i)
        cp.enqueue(l->target(i), b->count);
    b->count++;
}